

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.h
# Opt level: O2

void GPS2EnvCoordSystem(double lat_env,double long_env,double alt_env,double angle_env,
                       double latitude,double longitude,double altitude,double *pX,double *pY,
                       double *pZ)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 local_38;
  
  dVar1 = cos(latitude * 0.017453292519943295);
  dVar1 = dVar1 * (longitude - long_env) * 111194.92664455874;
  dVar2 = (latitude - lat_env) * 111194.92664455874;
  local_38 = -angle_env;
  dVar3 = cos(-angle_env);
  dVar4 = sin(local_38);
  *pX = dVar3 * dVar1 - dVar4 * dVar2;
  dVar3 = sin(local_38);
  dVar4 = cos(local_38);
  *pY = dVar3 * dVar1 + dVar4 * dVar2;
  *pZ = altitude - alt_env;
  return;
}

Assistant:

inline void GPS2EnvCoordSystem(double lat_env, double long_env, double alt_env, double angle_env,
							   double latitude, double longitude, double altitude,
							   double* pX, double* pY, double* pZ)
{
	double x_enu = 0, y_enu = 0, z_enu = 0;

	GPS2RefCoordSystem(lat_env, long_env, alt_env, latitude, longitude, altitude, &x_enu, &y_enu, &z_enu, EAST_NORTH_UP_COORDINATE_SYSTEM);

	// Conversion from East - North - Up to environment coordinate system.
	*pX = x_enu*cos(-angle_env)-y_enu*sin(-angle_env);
	*pY = x_enu*sin(-angle_env)+y_enu*cos(-angle_env);
	*pZ = z_enu;
}